

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O3

int njoy::tools::disco::Integer<4u>::
    read<int,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *param_2)

{
  bool bVar1;
  char *pcVar2;
  runtime_error *this;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  from_chars_result_t<char> fVar7;
  int value;
  int local_1c;
  
  pcVar2 = iter->_M_current;
  local_1c = 0;
  iVar5 = 0;
  pcVar6 = pcVar2;
  do {
    if (*pcVar6 != ' ') goto LAB_0011c323;
    iVar5 = iVar5 + 1;
    iter->_M_current = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (iVar5 != 4);
  iVar5 = 4;
LAB_0011c323:
  bVar1 = isNewLine<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(iter);
  if (!bVar1) {
    pcVar6 = iter->_M_current;
    if (iVar5 == 4 || *pcVar6 == -1) {
      return local_1c;
    }
    if (*pcVar6 == '+') {
      pcVar6 = pcVar6 + 1;
      iter->_M_current = pcVar6;
      iVar5 = iVar5 + 1;
      if (iVar5 == 4) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"cannot parse invalid integer number 1");
        goto LAB_0011c41d;
      }
    }
    fVar7 = fast_float::from_chars<int,char,int>(pcVar6,pcVar2 + 4,&local_1c,10);
    if (fVar7.ec != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"cannot parse invalid integer number 2");
LAB_0011c41d:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = (int)iter->_M_current;
    iter->_M_current = fVar7.ptr;
    uVar4 = ((int)fVar7.ptr - iVar3) + iVar5;
    if (uVar4 < 4) {
      iVar5 = ((iVar5 + (int)fVar7.ptr) - iVar3) + -4;
      pcVar2 = fVar7.ptr;
      do {
        if (*pcVar2 != ' ') goto LAB_0011c3a4;
        iter->_M_current = pcVar2 + 1;
        iVar5 = iVar5 + 1;
        pcVar2 = pcVar2 + 1;
      } while (iVar5 != 0);
    }
    else if (uVar4 != 4) {
LAB_0011c3a4:
      bVar1 = isNewLine<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(iter);
      if ((!bVar1) && (*iter->_M_current != -1)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"cannot parse invalid integer number 3");
        goto LAB_0011c41d;
      }
    }
  }
  return local_1c;
}

Assistant:

static Representation read( Iterator& iter, const Iterator& ) {

    unsigned int position = 0;
    const auto end = iter + Width;
    Representation value = 0;

    skipSpaces( iter, position );
    if ( isNewLine( iter ) || isEndOfFile( iter ) || Width == position ) {

      return value;
    }

    skipPlusSign( iter, position );
    if ( Width == position ) {

      throw std::runtime_error( "cannot parse invalid integer number 1" );
    }

    // we are using fast_float::from_chars instead of std::from_chars since
    // not all standard c++ libraries implement the floating point version of
    // std::from_chars
    auto result = fast_float::from_chars( &*iter, &*end, value );
    if ( result.ec == std::errc() ) {

      auto advance = result.ptr - &*iter;
      iter += advance;
      position += advance;
    }
    else {

      throw std::runtime_error( "cannot parse invalid integer number 2" );
    }

    skipSpaces( iter, position );
    if ( Width != position ) {

      if ( ! isNewLine( iter ) && ! isEndOfFile( iter ) ) {

        throw std::runtime_error( "cannot parse invalid integer number 3" );
      }
    }

    return value;
  }